

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

size_t pe_util::getAsciiLenW(WORD *inp,size_t maxInp,bool acceptNotTerminated)

{
  WORD WVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = 0;
  sVar3 = sVar2;
  if (maxInp != 0) {
    do {
      WVar1 = inp[sVar2];
      if (WVar1 == 0) {
        return sVar2;
      }
    } while (((((ushort)(WVar1 - 0x20) < 0x5f) || (WVar1 == 0xd)) || (sVar3 = sVar2, WVar1 == 10))
            && (sVar2 = sVar2 + 1, sVar3 = maxInp, maxInp != sVar2));
  }
  if (!acceptNotTerminated) {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t pe_util::getAsciiLenW(const WORD *inp, size_t maxInp, bool acceptNotTerminated)
{
    size_t i = 0;
    for (; i < maxInp; i++) {
        const WORD w = inp[i];
        if (w == 0) return i; //end of string
        if (!IS_PRINTABLE(w) && !IS_ENDLINE(w)) break;
    }
    if (acceptNotTerminated) return i;
    return 0;
}